

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::extractLaneI32x4(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  LaneArray<4> local_80;
  byte local_19;
  Literal *pLStack_18;
  uint8_t index_local;
  Literal *this_local;
  
  local_19 = index;
  pLStack_18 = this;
  this_local = __return_storage_ptr__;
  getLanesI32x4(&local_80,this);
  other = std::array<wasm::Literal,_4UL>::at(&local_80,(ulong)local_19);
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_4UL>::~array(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneI32x4(uint8_t index) const {
  return getLanesI32x4().at(index);
}